

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

bool __thiscall GrcManager::Compile(GrcManager *this,GrcFont *param_2,char *pchOutputPath)

{
  bool bVar1;
  GrcManager *in_RDI;
  GrcManager *in_stack_00000030;
  GrcManager *in_stack_00000050;
  char *in_stack_ffffffffffffffd8;
  
  bVar1 = IncludePassOptimizations(in_RDI);
  if (bVar1) {
    PassOptimizations(in_stack_00000030);
  }
  bVar1 = IsVerbose(in_RDI);
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"[Generating FSMs: ");
  }
  GenerateFsms(in_RDI,in_stack_ffffffffffffffd8);
  bVar1 = IsVerbose(in_RDI);
  if (bVar1) {
    std::operator<<((ostream *)&std::cout,"]\n");
  }
  CalculateContextOffsets((GrcManager *)0x112271);
  CalculateGlatVersion(in_stack_00000050);
  return false;
}

Assistant:

bool GrcManager::Compile(GrcFont * /*pfont*/, char * pchOutputPath)
{
	if (IncludePassOptimizations())
		PassOptimizations();
	if (this->IsVerbose())
		std::cout << "[Generating FSMs: ";
	GenerateFsms(pchOutputPath);
	if (this->IsVerbose())
		std::cout << "]\n";
	CalculateContextOffsets();	// after max-rule-context has been set
	CalculateGlatVersion();		// before outputting debug files
	return false;
}